

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::GenTableObject(RustGenerator *this,StructDef *table)

{
  IdlNamer *pIVar1;
  CodeWriter *this_00;
  allocator<char> local_341;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"STRUCT_OTY",&local_341);
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_320,pIVar1,table);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_340,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"STRUCT_TY",&local_341);
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_320,pIVar1,table);
  CodeWriter::SetValue(this_00,&local_340,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"#[non_exhaustive]",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"#[derive(Debug, Clone, PartialEq)]",(allocator<char> *)&local_340)
  ;
  CodeWriter::operator+=(this_00,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"{{ACCESS_TYPE}} struct {{STRUCT_OTY}} {",
             (allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:2223:36)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:2223:36)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  ForAllObjectTableFields(this,table,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"}",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"impl Default for {{STRUCT_OTY}} {",(allocator<char> *)&local_340)
  ;
  CodeWriter::operator+=(this_00,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"  fn default() -> Self {",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"    Self {",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:2234:36)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:2234:36)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  ForAllObjectTableFields(this,table,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"    }",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"  }",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"}",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"impl {{STRUCT_OTY}} {",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"  pub fn pack<\'b, A: flatbuffers::Allocator + \'b>(",
             (allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"    &self,",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"    _fbb: &mut flatbuffers::FlatBufferBuilder<\'b, A>",
             (allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"  ) -> flatbuffers::WIPOffset<{{STRUCT_TY}}<\'b>> {",
             (allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  local_80._8_8_ = 0;
  local_68 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:2254:36)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:2254:36)>
             ::_M_manager;
  local_80._M_unused._M_object = this;
  ForAllObjectTableFields(this,table,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"    {{STRUCT_TY}}::create(_fbb, &{{STRUCT_TY}}Args{",
             (allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  local_a0._8_8_ = 0;
  local_88 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:2343:36)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(const_flatbuffers::FieldDef_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:2343:36)>
             ::_M_manager;
  local_a0._M_unused._M_object = this;
  ForAllObjectTableFields(this,table,(function<void_(const_flatbuffers::FieldDef_&)> *)&local_a0);
  std::_Function_base::~_Function_base((_Function_base *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"    })",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"  }",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"}",(allocator<char> *)&local_340);
  CodeWriter::operator+=(this_00,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  return;
}

Assistant:

void GenTableObject(const StructDef &table) {
    code_.SetValue("STRUCT_OTY", namer_.ObjectType(table));
    code_.SetValue("STRUCT_TY", namer_.Type(table));

    // Generate the native object.
    code_ += "#[non_exhaustive]";
    code_ += "#[derive(Debug, Clone, PartialEq)]";
    code_ += "{{ACCESS_TYPE}} struct {{STRUCT_OTY}} {";
    ForAllObjectTableFields(table, [&](const FieldDef &field) {
      // Union objects combine both the union discriminant and value, so we
      // skip making a field for the discriminant.
      if (field.value.type.base_type == BASE_TYPE_UTYPE) return;
      code_ += "pub {{FIELD}}: {{FIELD_OTY}},";
    });
    code_ += "}";

    code_ += "impl Default for {{STRUCT_OTY}} {";
    code_ += "  fn default() -> Self {";
    code_ += "    Self {";
    ForAllObjectTableFields(table, [&](const FieldDef &field) {
      if (field.value.type.base_type == BASE_TYPE_UTYPE) return;
      std::string default_value = GetDefaultValue(field, kObject);
      code_ += "    {{FIELD}}: " + default_value + ",";
    });
    code_ += "    }";
    code_ += "  }";
    code_ += "}";

    // TODO(cneo): Generate defaults for Native tables. However, since structs
    // may be required, they, and therefore enums need defaults.

    // Generate pack function.
    code_ += "impl {{STRUCT_OTY}} {";
    code_ += "  pub fn pack<'b, A: flatbuffers::Allocator + 'b>(";
    code_ += "    &self,";
    code_ += "    _fbb: &mut flatbuffers::FlatBufferBuilder<'b, A>";
    code_ += "  ) -> flatbuffers::WIPOffset<{{STRUCT_TY}}<'b>> {";
    // First we generate variables for each field and then later assemble them
    // using "StructArgs" to more easily manage ownership of the builder.
    ForAllObjectTableFields(table, [&](const FieldDef &field) {
      const Type &type = field.value.type;
      switch (GetFullType(type)) {
        case ftInteger:
        case ftBool:
        case ftFloat:
        case ftEnumKey: {
          code_ += "  let {{FIELD}} = self.{{FIELD}};";
          return;
        }
        case ftUnionKey: return;  // Generate union type with union value.
        case ftUnionValue: {
          code_.SetValue("ENUM_METHOD",
                         namer_.Method(*field.value.type.enum_def));
          code_.SetValue("DISCRIMINANT",
                         namer_.LegacyRustUnionTypeMethod(field));
          code_ +=
              "  let {{DISCRIMINANT}} = "
              "self.{{FIELD}}.{{ENUM_METHOD}}_type();";
          code_ += "  let {{FIELD}} = self.{{FIELD}}.pack(_fbb);";
          return;
        }
        // The rest of the types require special casing around optionalness
        // due to "required" annotation.
        case ftString: {
          MapNativeTableField(field, "_fbb.create_string(x)");
          return;
        }
        case ftStruct: {
          // Hold the struct in a variable so we can reference it.
          if (field.IsRequired()) {
            code_ += "  let {{FIELD}}_tmp = Some(self.{{FIELD}}.pack());";
          } else {
            code_ +=
                "  let {{FIELD}}_tmp = self.{{FIELD}}"
                ".as_ref().map(|x| x.pack());";
          }
          code_ += "  let {{FIELD}} = {{FIELD}}_tmp.as_ref();";

          return;
        }
        case ftTable: {
          MapNativeTableField(field, "x.pack(_fbb)");
          return;
        }
        case ftVectorOfEnumKey:
        case ftVectorOfInteger:
        case ftVectorOfBool:
        case ftVectorOfFloat: {
          MapNativeTableField(field, "_fbb.create_vector(x)");
          return;
        }
        case ftVectorOfStruct: {
          MapNativeTableField(
              field,
              "let w: Vec<_> = x.iter().map(|t| t.pack()).collect();"
              "_fbb.create_vector(&w)");
          return;
        }
        case ftVectorOfString: {
          // TODO(cneo): create_vector* should be more generic to avoid
          // allocations.

          MapNativeTableField(field,
                              "let w: Vec<_> = x.iter().map(|s| "
                              "_fbb.create_string(s)).collect();"
                              "_fbb.create_vector(&w)");
          return;
        }
        case ftVectorOfTable: {
          MapNativeTableField(
              field,
              "let w: Vec<_> = x.iter().map(|t| t.pack(_fbb)).collect();"
              "_fbb.create_vector(&w)");
          return;
        }
        case ftVectorOfUnionValue: {
          FLATBUFFERS_ASSERT(false && "vectors of unions not yet supported");
          return;
        }
        case ftArrayOfEnum:
        case ftArrayOfStruct:
        case ftArrayOfBuiltin: {
          FLATBUFFERS_ASSERT(false && "arrays are not supported within tables");
          return;
        }
      }
    });
    code_ += "    {{STRUCT_TY}}::create(_fbb, &{{STRUCT_TY}}Args{";
    ForAllObjectTableFields(table, [&](const FieldDef &field) {
      (void)field;  // Unused.
      code_ += "    {{FIELD}},";
    });
    code_ += "    })";
    code_ += "  }";
    code_ += "}";
  }